

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O0

DdNode * Llb_ManComputeImage(Llb_Man_t *p,DdNode *bInit,int fBackward)

{
  Llb_Grp_t *pGroup_00;
  DdNode *pDVar1;
  DdNode *n;
  DdNode *n_00;
  Aig_Obj_t *pObj;
  int local_58;
  int ObjId;
  int Index;
  int k;
  DdNode *bTemp;
  DdNode *bCube;
  DdNode *bGroup;
  DdNode *bImage;
  Llb_Grp_t *pGroup;
  int fCheckSupport;
  int fBackward_local;
  DdNode *bInit_local;
  Llb_Man_t *p_local;
  
  Cudd_Ref(bInit);
  ObjId = 1;
  bGroup = bInit;
  while( true ) {
    if (p->pMatrix->nCols + -1 <= ObjId) {
      Cudd_Deref(bGroup);
      return bGroup;
    }
    if (fBackward == 0) {
      local_58 = ObjId;
    }
    else {
      local_58 = (p->pMatrix->nCols + -1) - ObjId;
    }
    pGroup_00 = p->pMatrix->pColGrps[local_58];
    pDVar1 = Llb_ManConstructGroupBdd(p,pGroup_00);
    if (pDVar1 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(p->dd,bGroup);
      return (DdNode *)0x0;
    }
    Cudd_Ref(pDVar1);
    n = Llb_ManConstructQuantCubeIntern(p,pGroup_00,local_58,fBackward);
    Cudd_Ref(n);
    n_00 = Cudd_bddExistAbstract(p->dd,pDVar1,n);
    if (n_00 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(p->dd,pDVar1);
      Cudd_RecursiveDeref(p->dd,n);
      return (DdNode *)0x0;
    }
    Cudd_Ref(n_00);
    Cudd_RecursiveDeref(p->dd,pDVar1);
    Cudd_RecursiveDeref(p->dd,n);
    if (fBackward == 0) {
      bTemp = Llb_ManConstructQuantCubeFwd(p,pGroup_00,local_58);
    }
    else {
      bTemp = Llb_ManConstructQuantCubeBwd(p,pGroup_00,local_58);
    }
    Cudd_Ref(bTemp);
    pDVar1 = Cudd_bddAndAbstract(p->dd,bGroup,n_00,bTemp);
    if (pDVar1 == (DdNode *)0x0) break;
    Cudd_Ref(pDVar1);
    Cudd_RecursiveDeref(p->dd,bGroup);
    Cudd_RecursiveDeref(p->dd,n_00);
    Cudd_RecursiveDeref(p->dd,bTemp);
    ObjId = ObjId + 1;
    bGroup = pDVar1;
  }
  Cudd_RecursiveDeref(p->dd,bGroup);
  Cudd_RecursiveDeref(p->dd,n_00);
  Cudd_RecursiveDeref(p->dd,bTemp);
  return (DdNode *)0x0;
}

Assistant:

DdNode * Llb_ManComputeImage( Llb_Man_t * p, DdNode * bInit, int fBackward )
{
    int fCheckSupport = 0;
    Llb_Grp_t * pGroup;
    DdNode * bImage, * bGroup, * bCube, * bTemp;
    int k, Index;
    bImage = bInit;  Cudd_Ref( bImage );
    for ( k = 1; k < p->pMatrix->nCols-1; k++ )
    {
        if ( fBackward )
            Index = p->pMatrix->nCols - 1 - k;
        else
            Index = k;

        // compute group BDD
        pGroup = p->pMatrix->pColGrps[Index];
        bGroup = Llb_ManConstructGroupBdd( p, pGroup );
        if ( bGroup == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bImage );
            return NULL;
        }
        Cudd_Ref( bGroup );
        // quantify variables appearing only in this group
        bCube  = Llb_ManConstructQuantCubeIntern( p, pGroup, Index, fBackward );       Cudd_Ref( bCube );
        bGroup = Cudd_bddExistAbstract( p->dd, bTemp = bGroup, bCube );         
        if ( bGroup == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bTemp );
            Cudd_RecursiveDeref( p->dd, bCube );
            return NULL;
        }
        Cudd_Ref( bGroup );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bCube );
        // perform partial product
        if ( fBackward )
            bCube  = Llb_ManConstructQuantCubeBwd( p, pGroup, Index );
        else
            bCube  = Llb_ManConstructQuantCubeFwd( p, pGroup, Index );
        Cudd_Ref( bCube );
//        bImage = Extra_bddAndAbstractTime( p->dd, bTemp = bImage, bGroup, bCube, p->pPars->TimeTarget );   
        bImage = Cudd_bddAndAbstract( p->dd, bTemp = bImage, bGroup, bCube );   
        if ( bImage == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bTemp );
            Cudd_RecursiveDeref( p->dd, bGroup );
            Cudd_RecursiveDeref( p->dd, bCube );
            return NULL;
        }
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bGroup );
        Cudd_RecursiveDeref( p->dd, bCube );
    }

    // make sure image depends on next state vars
    if ( fCheckSupport )
    {
        bCube = Cudd_Support( p->dd, bImage );    Cudd_Ref( bCube );
        for ( bTemp = bCube; bTemp != p->dd->one; bTemp = cuddT(bTemp) )
        {
            int ObjId = Vec_IntEntry( p->vVar2Obj, bTemp->index );
            Aig_Obj_t * pObj = Aig_ManObj( p->pAig, ObjId );
            if ( !Saig_ObjIsLi(p->pAig, pObj) )
                printf( "Var %d assigned to obj %d that is not LI\n", bTemp->index, ObjId );
        }
        Cudd_RecursiveDeref( p->dd, bCube );
    }
    Cudd_Deref( bImage );
    return bImage;
}